

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O2

void __thiscall dgPolyhedra::EndFace(dgPolyhedra *this)

{
  dgEdge *pdVar1;
  dgRedBackNode *pdVar2;
  dgEdge *pdVar3;
  dgEdge **ppdVar4;
  dgTreeNode *pdVar5;
  ulong uVar6;
  dgEdge *pdVar7;
  uint uVar8;
  bool state;
  dgStack<dgEdge_*> edgeArrayPool;
  bool local_81;
  Iterator local_80;
  dgStack<dgEdge_*> local_70;
  undefined1 local_60 [40];
  HaI32 local_38;
  
  local_80.m_tree = &this->super_dgTree<dgEdge,_long>;
  local_80.m_ptr =
       &dgTree<dgEdge,_long>::Minimum(&this->super_dgTree<dgEdge,_long>)->super_dgRedBackNode;
  while (pdVar2 = local_80.m_ptr, (dgTreeNode *)local_80.m_ptr != (dgTreeNode *)0x0) {
    if (((dgEdge *)((long)local_80.m_ptr + 0x28))->m_twin == (dgEdge *)0x0) {
      pdVar3 = FindEdge(this,((dgEdge *)((long)local_80.m_ptr + 0x28))->m_next->m_incidentVertex,
                        ((dgEdge *)((long)local_80.m_ptr + 0x28))->m_incidentVertex);
      ((dgEdge *)((long)pdVar2 + 0x28))->m_twin = pdVar3;
      if (pdVar3 != (dgEdge *)0x0) {
        pdVar3->m_twin = (dgEdge *)((long)pdVar2 + 0x28);
      }
    }
    dgTree<dgEdge,_long>::Iterator::operator++(&local_80,0);
  }
  dgStack<dgEdge_*>::dgStack(&local_70,(this->super_dgTree<dgEdge,_long>).m_count * 2 + 0x100);
  uVar8 = 0;
  ppdVar4 = dgStack<dgEdge_*>::operator[](&local_70,0);
  local_80.m_ptr = &dgTree<dgEdge,_long>::Minimum(local_80.m_tree)->super_dgRedBackNode;
  do {
    pdVar2 = local_80.m_ptr;
    if ((dgTreeNode *)local_80.m_ptr == (dgTreeNode *)0x0) {
      uVar6 = 0;
      while( true ) {
        if (uVar6 == (~((int)uVar8 >> 0x1f) & uVar8)) {
          free(local_70.super_dgStackBase.m_ptr);
          return;
        }
        pdVar3 = ppdVar4[uVar6];
        pdVar7 = pdVar3;
        if (pdVar3->m_prev != (dgEdge *)0x0) break;
        do {
          pdVar1 = pdVar7->m_twin;
          pdVar7 = pdVar1->m_next;
        } while (pdVar7 != (dgEdge *)0x0);
        pdVar1->m_next = pdVar3;
        pdVar3->m_prev = pdVar1;
        uVar6 = uVar6 + 1;
      }
      __assert_fail("!edge->m_prev",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                    ,0x7b7,"void dgPolyhedra::EndFace()");
    }
    if (((dgEdge *)((long)local_80.m_ptr + 0x28))->m_twin == (dgEdge *)0x0) {
      local_60._0_4_ = ((dgEdge *)((long)local_80.m_ptr + 0x28))->m_next->m_incidentVertex;
      local_60._8_32_ = ZEXT1632(ZEXT816(0) << 0x40);
      local_38 = 0;
      local_60._4_4_ = -1;
      pdVar5 = dgTree<dgEdge,_long>::Insert
                         (&this->super_dgTree<dgEdge,_long>,(dgEdge *)local_60,
                          (ulong)(uint)local_60._0_4_ << 0x20 |
                          (long)((dgEdge *)((long)local_80.m_ptr + 0x28))->m_incidentVertex,
                          &local_81);
      if (local_81 == true) {
        __assert_fail("!state",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                      ,0x7ad,"void dgPolyhedra::EndFace()");
      }
      ((dgEdge *)((long)pdVar2 + 0x28))->m_twin = &pdVar5->m_info;
      (pdVar5->m_info).m_twin = (dgEdge *)((long)pdVar2 + 0x28);
      ppdVar4[(int)uVar8] = ((dgEdge *)((long)pdVar2 + 0x28))->m_twin;
      uVar8 = uVar8 + 1;
    }
    dgTree<dgEdge,_long>::Iterator::operator++(&local_80,0);
  } while( true );
}

Assistant:

void dgPolyhedra::EndFace ()
{
	dgPolyhedra::Iterator iter (*this);

	// Connect all twin edge
	for (iter.Begin(); iter; iter ++) {
		dgEdge* const edge = &(*iter);
		if (!edge->m_twin) {
			edge->m_twin = FindEdge (edge->m_next->m_incidentVertex, edge->m_incidentVertex);
			if (edge->m_twin) {
				edge->m_twin->m_twin = edge; 
			}
		}
	}

#ifdef __ENABLE_SANITY_CHECK 
	HACD_ASSERT (SanityCheck());
#endif
	dgStack<dgEdge*> edgeArrayPool(GetCount() * 2 + 256);

	hacd::HaI32 edgeCount = 0;
	dgEdge** const edgeArray = &edgeArrayPool[0];
	for (iter.Begin(); iter; iter ++) {
		dgEdge* const edge = &(*iter);
		if (!edge->m_twin) {
			bool state;
			dgPolyhedra::dgPairKey code (edge->m_next->m_incidentVertex, edge->m_incidentVertex);
			dgEdge tmpEdge (edge->m_next->m_incidentVertex, -1);
			tmpEdge.m_incidentFace = -1; 
			dgPolyhedra::dgTreeNode* const node = Insert (tmpEdge, code.GetVal(), state); 
			HACD_ASSERT (!state);
			edge->m_twin = &node->GetInfo();
			edge->m_twin->m_twin = edge; 
			edgeArray[edgeCount] = edge->m_twin;
			edgeCount ++;
		}
	}

	for (hacd::HaI32 i = 0; i < edgeCount; i ++) {
		dgEdge* const edge = edgeArray[i];
		HACD_ASSERT (!edge->m_prev);
		dgEdge *ptr = edge->m_twin;
		for (; ptr->m_next; ptr = ptr->m_next->m_twin){}
		ptr->m_next = edge;
		edge->m_prev = ptr;
	}

#ifdef __ENABLE_SANITY_CHECK 
	HACD_ASSERT (SanityCheck ());
#endif
}